

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void nonnewline(parse *p)

{
  char local_2c [4];
  char *local_28;
  char *pcStack_20;
  
  local_28 = p->next;
  pcStack_20 = p->end;
  p->next = local_2c;
  p->end = local_2c + 3;
  builtin_strncpy(local_2c,"^\n]",4);
  p_bracket(p);
  if (p->next == local_2c + 3) {
    p->next = local_28;
    p->end = pcStack_20;
    return;
  }
  __assert_fail("p->next == bracket+3",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                ,0x410,"void nonnewline()");
}

Assistant:

static void
nonnewline(p)
struct parse *p;
{
	char *oldnext = p->next;
	char *oldend = p->end;
	char bracket[4];

	p->next = bracket;
	p->end = bracket+3;
	bracket[0] = '^';
	bracket[1] = '\n';
	bracket[2] = ']';
	bracket[3] = '\0';
	p_bracket(p);
	assert(p->next == bracket+3);
	p->next = oldnext;
	p->end = oldend;
}